

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O1

void __thiscall QAccessibleTabBar::~QAccessibleTabBar(QAccessibleTabBar *this)

{
  ulong uVar1;
  Data *pDVar2;
  ulong uVar3;
  
  *(undefined ***)&this->super_QAccessibleWidget = &PTR__QAccessibleTabBar_008144e8;
  *(undefined ***)&(this->super_QAccessibleWidget).super_QAccessibleActionInterface =
       &PTR__QAccessibleTabBar_008145f8;
  *(undefined ***)&this->super_QAccessibleSelectionInterface = &PTR__QAccessibleTabBar_00814640;
  pDVar2 = (this->m_childInterfaces).d;
  if (pDVar2 == (Data *)0x0) {
    pDVar2 = (Data *)0x0;
  }
  else if (pDVar2->spans->offsets[0] == 0xff) {
    uVar1 = 1;
    do {
      uVar3 = uVar1;
      if (pDVar2->numBuckets == uVar3) {
        pDVar2 = (Data *)0x0;
        uVar3 = 0;
        break;
      }
      uVar1 = uVar3 + 1;
    } while (pDVar2->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
    goto LAB_0051ee57;
  }
  uVar3 = 0;
LAB_0051ee57:
  if (pDVar2 != (Data *)0x0 || uVar3 != 0) {
    do {
      QAccessible::deleteAccessibleInterface
                (*(uint *)(pDVar2->spans[uVar3 >> 7].entries
                           [pDVar2->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f]].storage.data + 4)
                );
      do {
        if (pDVar2->numBuckets - 1 == uVar3) {
          pDVar2 = (Data *)0x0;
          uVar3 = 0;
          break;
        }
        uVar3 = uVar3 + 1;
      } while (pDVar2->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
    } while ((pDVar2 != (Data *)0x0) || (uVar3 != 0));
  }
  QHash<int,_unsigned_int>::~QHash(&this->m_childInterfaces);
  QAccessibleSelectionInterface::~QAccessibleSelectionInterface
            (&this->super_QAccessibleSelectionInterface);
  QAccessibleWidget::~QAccessibleWidget(&this->super_QAccessibleWidget);
  return;
}

Assistant:

QAccessibleTabBar::~QAccessibleTabBar()
{
    for (QAccessible::Id id : std::as_const(m_childInterfaces))
        QAccessible::deleteAccessibleInterface(id);
}